

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O0

bool __thiscall
SF_FlateLzwDecode::setDecodeParms(SF_FlateLzwDecode *this,QPDFObjectHandle *decode_parms)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  undefined1 local_b0 [4];
  int earlychange;
  uint local_9c;
  int local_98;
  int val;
  undefined1 local_88 [8];
  QPDFObjectHandle value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  unsigned_long_long memory_limit;
  QPDFObjectHandle *decode_parms_local;
  SF_FlateLzwDecode *this_local;
  
  bVar1 = QPDFObjectHandle::isNull(decode_parms);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    keys._M_t._M_impl.super__Rb_tree_header._M_node_count = Pl_Flate::memory_limit();
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,decode_parms);
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&key), bVar1) {
      value.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_88,(string *)decode_parms);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi,"/Predictor");
      if (bVar1) {
        bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_88);
        if (bVar1) {
          iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_88);
          this->predictor = iVar2;
          if (((this->predictor == 1) || (this->predictor == 2)) ||
             ((9 < this->predictor && (this->predictor < 0x10)))) goto LAB_003ca1fb;
          this_local._7_1_ = 0;
          local_98 = 1;
        }
        else {
          this_local._7_1_ = 0;
          local_98 = 1;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,"/Columns");
        if (((bVar1) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)value.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi,"/Colors"), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi,"/BitsPerComponent"), bVar1)) {
          bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_88);
          if (bVar1) {
            local_9c = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_88);
            if ((keys._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
               (local_9c <= keys._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value.super_BaseHandle.obj.
                                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount._M_pi,"/Columns");
              if (bVar1) {
                this->columns = local_9c;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi,"/Colors");
                if (bVar1) {
                  this->colors = local_9c;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value.super_BaseHandle.obj.
                                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi,"/BitsPerComponent");
                  if (bVar1) {
                    this->bits_per_component = local_9c;
                  }
                }
              }
              goto LAB_003ca1fb;
            }
            QPDFLogger::defaultLogger();
            this_00 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_b0);
            QPDFLogger::warn(this_00,"SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
            std::shared_ptr<QPDFLogger>::~shared_ptr((shared_ptr<QPDFLogger> *)local_b0);
            this_local._7_1_ = 0;
            local_98 = 1;
          }
          else {
            this_local._7_1_ = 0;
            local_98 = 1;
          }
        }
        else if (((this->lzw & 1U) == 0) ||
                (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)value.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi,"/EarlyChange"), !bVar1)) {
LAB_003ca1fb:
          local_98 = 0;
        }
        else {
          bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_88);
          if (bVar1) {
            iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_88);
            this->early_code_change = iVar2 == 1;
            if ((iVar2 == 0) || (iVar2 == 1)) goto LAB_003ca1fb;
            this_local._7_1_ = 0;
            local_98 = 1;
          }
          else {
            this_local._7_1_ = 0;
            local_98 = 1;
          }
        }
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
      if (local_98 != 0) goto LAB_003ca26d;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    if ((this->predictor < 2) || (this->columns != 0)) {
      this_local._7_1_ = 1;
      local_98 = 1;
    }
    else {
      this_local._7_1_ = 0;
      local_98 = 1;
    }
LAB_003ca26d:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
SF_FlateLzwDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    if (decode_parms.isNull()) {
        return true;
    }

    auto memory_limit = Pl_Flate::memory_limit();

    std::set<std::string> keys = decode_parms.getKeys();
    for (auto const& key: keys) {
        QPDFObjectHandle value = decode_parms.getKey(key);
        if (key == "/Predictor") {
            if (value.isInteger()) {
                predictor = value.getIntValueAsInt();
                if (!(predictor == 1 || predictor == 2 || (predictor >= 10 && predictor <= 15))) {
                    return false;
                }
            } else {
                return false;
            }
        } else if (key == "/Columns" || key == "/Colors" || key == "/BitsPerComponent") {
            if (value.isInteger()) {
                int val = value.getIntValueAsInt();
                if (memory_limit && static_cast<unsigned int>(val) > memory_limit) {
                    QPDFLogger::defaultLogger()->warn(
                        "SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
                    return false;
                }
                if (key == "/Columns") {
                    columns = val;
                } else if (key == "/Colors") {
                    colors = val;
                } else if (key == "/BitsPerComponent") {
                    bits_per_component = val;
                }
            } else {
                return false;
            }
        } else if (lzw && (key == "/EarlyChange")) {
            if (value.isInteger()) {
                int earlychange = value.getIntValueAsInt();
                early_code_change = (earlychange == 1);
                if (!(earlychange == 0 || earlychange == 1)) {
                    return false;
                }
            } else {
                return false;
            }
        }
    }

    if (predictor > 1 && columns == 0) {
        return false;
    }

    return true;
}